

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O0

bool __thiscall SectionHdrWrapper::reloadName(SectionHdrWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  qsizetype qVar3;
  QString local_58;
  QString local_40;
  undefined8 local_28;
  size_t BUF_LEN;
  IMAGE_SECTION_HEADER *header;
  SectionHdrWrapper *this_local;
  
  header = (IMAGE_SECTION_HEADER *)this;
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  BUF_LEN = CONCAT44(extraout_var,iVar1);
  if ((long *)BUF_LEN == (long *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((this->name == (char *)0x0) || (*(long *)this->name != *(long *)BUF_LEN)) {
    local_28 = 10;
    if (this->name == (char *)0x0) {
      pcVar2 = (char *)calloc(10,1);
      this->name = pcVar2;
    }
    memset(this->name,0,10);
    *(undefined8 *)this->name = *(undefined8 *)BUF_LEN;
    QString::operator=(&this->mappedName,this->name);
    qVar3 = QString::length(&this->mappedName);
    if (qVar3 == 0) {
      QString::number((ulong)&local_58,(int)this->sectNum);
      operator+(&local_40,"#",&local_58);
      QString::operator=(&this->mappedName,(QString *)&local_40);
      QString::~QString(&local_40);
      QString::~QString(&local_58);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SectionHdrWrapper::reloadName()
{
    IMAGE_SECTION_HEADER* header = (IMAGE_SECTION_HEADER*) getPtr();
    if (!header) return false;

    if (this->name) {
        if (memcmp(this->name, header->Name, SECNAME_LEN) == 0) {
            return true; //no need to reload
        }
    }
    const size_t BUF_LEN = SECNAME_LEN + 2;
    if (!this->name) {
        this->name = (char*)::calloc(BUF_LEN, 1);
    }
    ::memset(this->name, 0, BUF_LEN);
    ::memcpy(this->name, header->Name, SECNAME_LEN);
    this->mappedName = this->name;
    if (this->mappedName.length() == 0) {
        this->mappedName = "#" + QString::number(this->sectNum, 10);
    }
    return true;
}